

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcElectricFlowStorageDeviceType::IfcElectricFlowStorageDeviceType
          (IfcElectricFlowStorageDeviceType *this)

{
  *(undefined ***)&this->field_0x1e0 = &PTR__Object_007e4a70;
  *(undefined8 *)&this->field_0x1e8 = 0;
  *(char **)&this->field_0x1f0 = "IfcElectricFlowStorageDeviceType";
  Schema_2x3::IfcFlowStorageDeviceType::IfcFlowStorageDeviceType
            (&this->super_IfcFlowStorageDeviceType,&PTR_construction_vtable_24__00865b80);
  *(undefined8 *)&(this->super_IfcFlowStorageDeviceType).field_0x1b8 = 0;
  *(undefined8 *)
   &(this->super_IfcFlowStorageDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject =
       0x865a00;
  *(undefined8 *)&this->field_0x1e0 = 0x865b68;
  *(undefined8 *)
   &(this->super_IfcFlowStorageDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x88 = 0x865a28;
  (this->super_IfcFlowStorageDeviceType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x865a50;
  *(undefined8 *)
   &(this->super_IfcFlowStorageDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0xf0 = 0x865a78;
  *(undefined8 *)
   &(this->super_IfcFlowStorageDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0x865aa0;
  *(undefined8 *)
   &(this->super_IfcFlowStorageDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x180 = 0x865ac8;
  *(undefined8 *)
   &(this->super_IfcFlowStorageDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x190 = 0x865af0;
  *(undefined8 *)
   &(this->super_IfcFlowStorageDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.field_0x1a0 = 0x865b18;
  *(undefined8 *)
   &(this->super_IfcFlowStorageDeviceType).super_IfcDistributionFlowElementType.field_0x1b0 =
       0x865b40;
  *(undefined1 **)&(this->super_IfcFlowStorageDeviceType).field_0x1c0 = &this->field_0x1d0;
  *(undefined8 *)&this->field_0x1c8 = 0;
  this->field_0x1d0 = 0;
  return;
}

Assistant:

IfcElectricFlowStorageDeviceType() : Object("IfcElectricFlowStorageDeviceType") {}